

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O3

void __thiscall
FIX::MessageStoreExceptionWrapper::setNextTargetMsgSeqNum
          (MessageStoreExceptionWrapper *this,int num,bool *threw,IOException *ex)

{
  *threw = false;
  (**(code **)(**(long **)this + 0x38))();
  return;
}

Assistant:

void MessageStoreExceptionWrapper::setNextTargetMsgSeqNum( int num, bool& threw, IOException& ex )
{
  threw = false;
  try { m_pStore->setNextTargetMsgSeqNum( num ); }
  catch ( IOException & e ) { threw = true; ex = e; }
}